

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O3

void ff_init_long(flexfloat_t *obj,long value,flexfloat_desc_t desc)

{
  obj->value = (double)value;
  obj->desc = desc;
  flexfloat_sanitize(obj);
  return;
}

Assistant:

INLINE void ff_init_long(flexfloat_t *obj, long value, flexfloat_desc_t desc) {
    obj->value = (fp_t)value;
    #ifdef FLEXFLOAT_TRACKING
    obj->exact_value = (fp_t)value;
    obj->tracking_fn = 0;
    obj->tracking_arg = 0;
    #endif
    obj->desc = desc;
    flexfloat_sanitize(obj);
}